

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_0::InvalidDrawCase::iterate(InvalidDrawCase *this)

{
  undefined *puVar1;
  int iVar2;
  deUint32 program_00;
  GLuint index;
  GLuint index_00;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  ProgramSources *pPVar6;
  size_type sVar7;
  reference pvVar8;
  MessageBuilder *pMVar9;
  bool bVar10;
  value_type local_658;
  MessageBuilder local_5e8;
  uint local_464;
  uint local_460;
  DrawElementsCommand drawCommand_1;
  uint local_2d0;
  uint local_2cc;
  DrawArraysCommand drawCommand;
  int dataSize_1;
  int dataSize;
  int ndx;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  int indexBufferSize;
  deInt32 colorLocation;
  deInt32 posLocation;
  deUint32 programID;
  ShaderSource local_260;
  allocator<char> local_231;
  string local_230;
  ShaderSource local_210;
  ProgramSources local_1d8;
  undefined1 local_108 [8];
  ShaderProgram program;
  CallLogWrapper gl;
  int overBoundInstances;
  int drawInstances;
  int overBoundDrawCount;
  int drawCount;
  InvalidDrawCase *this_local;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1d8);
  puVar1 = (anonymous_namespace)::s_colorVertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,puVar1,&local_231);
  glu::VertexSource::VertexSource((VertexSource *)&local_210,&local_230);
  pPVar6 = glu::ProgramSources::operator<<(&local_1d8,&local_210);
  puVar1 = (anonymous_namespace)::s_colorFragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&programID,puVar1,(allocator<char> *)((long)&posLocation + 3));
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_260,(string *)&programID);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_260);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_108,pRVar4,pPVar6);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_260);
  std::__cxx11::string::~string((string *)&programID);
  std::allocator<char>::~allocator((allocator<char> *)((long)&posLocation + 3));
  glu::VertexSource::~VertexSource((VertexSource *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  glu::ProgramSources::~ProgramSources(&local_1d8);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
  index = glu::CallLogWrapper::glGetAttribLocation
                    ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,program_00,"a_position")
  ;
  index_00 = glu::CallLogWrapper::glGetAttribLocation
                       ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,program_00,"a_color")
  ;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,true);
  glu::CallLogWrapper::glGenVertexArrays
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,1,&this->m_vao);
  glu::CallLogWrapper::glBindVertexArray
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,this->m_vao);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  glu::checkError(GVar3,"gen vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xbf);
  if (this->m_drawType == DRAW_ELEMENTS) {
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 10000;
    if (this->m_op == INVALID_INDEX_COUNT) {
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
    }
    sVar7 = (size_type)
            indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)((long)&dataSize + 3));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ndx,sVar7,
               (allocator<unsigned_short> *)((long)&dataSize + 3));
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)((long)&dataSize + 3));
    for (dataSize_1 = 0;
        sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ndx),
        dataSize_1 < (int)sVar7; dataSize_1 = dataSize_1 + 1) {
      local_658 = (value_type)dataSize_1;
      if (this->m_op == INVALID_INDEX) {
        local_658 = local_658 + 10000;
      }
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ndx,
                          (long)dataSize_1);
      *pvVar8 = local_658;
    }
    glu::CallLogWrapper::glGenBuffers
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,1,&this->m_indexBufferID);
    glu::CallLogWrapper::glBindBuffer
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8893,this->m_indexBufferID);
    sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ndx);
    pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ndx,0);
    glu::CallLogWrapper::glBufferData
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8893,(long)((int)sVar7 * 2),
               pvVar8,0x88e4);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0xcd);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ndx);
  }
  drawCommand.reservedMustBeZero = 10000;
  if (this->m_op == INVALID_DATA_COUNT) {
    drawCommand.reservedMustBeZero = 10;
  }
  glu::CallLogWrapper::glGenBuffers
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,1,&this->m_dataBufferID);
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8892,this->m_dataBufferID);
  glu::CallLogWrapper::glBufferData
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8892,
             (long)(int)drawCommand.reservedMustBeZero << 4,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,index,4,0x1406,'\0',0,
             (void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,index);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  glu::checkError(GVar3,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xda);
  drawCommand.first = 1;
  glu::CallLogWrapper::glGenBuffers
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,1,&this->m_colorBufferID);
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8892,this->m_colorBufferID);
  glu::CallLogWrapper::glBufferData
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8892,0x10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,index_00,4,0x1406,'\0',0,
             (void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,index_00);
  glu::CallLogWrapper::glVertexAttribDivisor
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,index_00,1);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  glu::checkError(GVar3,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xe7);
  if (this->m_drawType == DRAW_ARRAYS) {
    local_2d0 = 10000;
    local_2cc = 1;
    if (this->m_op == INVALID_DATA_INSTANCED) {
      local_2cc = 1000;
    }
    drawCommand.count = 0;
    if (this->m_op == INVALID_DATA_FIRST) {
      drawCommand.count = 10000;
    }
    bVar10 = this->m_op == INVALID_RESERVED;
    drawCommand.primCount = (uint)bVar10 + (uint)bVar10 * 4;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&drawCommand_1.baseVertex,pTVar5,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&drawCommand_1.baseVertex,(char (*) [13])"drawCommand:");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])"\n\tcount:\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2d0);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])"\n\tprimCount\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2cc);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])"\n\tfirst\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&drawCommand.count);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [22])"\n\treservedMustBeZero\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&drawCommand.primCount);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&drawCommand_1.baseVertex);
    glu::CallLogWrapper::glGenBuffers
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,1,&this->m_cmdBufferID);
    glu::CallLogWrapper::glBindBuffer
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8f3f,this->m_cmdBufferID);
    glu::CallLogWrapper::glBufferData
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8f3f,0x10,&local_2d0,0x88e4)
    ;
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0xff);
  }
  else if (this->m_drawType == DRAW_ELEMENTS) {
    local_464 = 10000;
    local_460 = 1;
    if (this->m_op == INVALID_DATA_INSTANCED) {
      local_460 = 1000;
    }
    drawCommand_1.primCount = 0;
    drawCommand_1.count = drawCommand_1.primCount;
    if (this->m_op == INVALID_INDEX_FIRST) {
      drawCommand_1.count = 10000;
    }
    if (this->m_op == INVALID_DATA_FIRST) {
      drawCommand_1.primCount = 10000;
    }
    bVar10 = this->m_op == INVALID_RESERVED;
    drawCommand_1.firstIndex = (uint)bVar10 + (uint)bVar10 * 4;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_5e8,(char (*) [13])"drawCommand:");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])"\n\tcount:\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_464);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])"\n\tprimCount\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_460);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])"\n\tfirstIndex\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&drawCommand_1.count);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])"\n\tbaseVertex\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&drawCommand_1.primCount);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [22])"\n\treservedMustBeZero\t");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&drawCommand_1.firstIndex);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5e8);
    glu::CallLogWrapper::glGenBuffers
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,1,&this->m_cmdBufferID);
    glu::CallLogWrapper::glBindBuffer
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8f3f,this->m_cmdBufferID);
    glu::CallLogWrapper::glBufferData
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0x8f3f,0x14,&local_464,0x88e4)
    ;
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0x117);
  }
  glu::CallLogWrapper::glViewport((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0,0,1,1);
  glu::CallLogWrapper::glUseProgram
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,program_00);
  if (this->m_drawType == DRAW_ELEMENTS) {
    glu::CallLogWrapper::glDrawElementsIndirect
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,4,0x1403,(void *)0x0);
  }
  else if (this->m_drawType == DRAW_ARRAYS) {
    glu::CallLogWrapper::glDrawArraysIndirect
              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,4,(void *)0x0);
  }
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,0);
  glu::CallLogWrapper::glFinish((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_108);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  return STOP;
}

Assistant:

InvalidDrawCase::IterateResult InvalidDrawCase::iterate (void)
{
	const int drawCount				= 10;		//!< number of elements safe to draw (all buffers have this)
	const int overBoundDrawCount	= 10000;	//!< number of elements in all other buffers than our target buffer
	const int drawInstances			= 1;
	const int overBoundInstances	= 1000;

	glu::CallLogWrapper gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_colorVertexShaderSource) << glu::FragmentSource(s_colorFragmentShaderSource));
	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.glGetAttribLocation(programID, "a_position");
	const deInt32		colorLocation	= gl.glGetAttribLocation(programID, "a_color");

	gl.enableLogging(true);

	gl.glGenVertexArrays(1, &m_vao);
	gl.glBindVertexArray(m_vao);
	glu::checkError(gl.glGetError(), "gen vao", __FILE__, __LINE__);

	// indices
	if (m_drawType == DRAW_ELEMENTS)
	{
		const int				indexBufferSize = (m_op == INVALID_INDEX_COUNT) ? (drawCount) : (overBoundDrawCount);
		std::vector<deUint16>	indices			(indexBufferSize);

		for (int ndx = 0; ndx < (int)indices.size(); ++ndx)
			indices[ndx] = (deUint16)((m_op == INVALID_INDEX) ? (overBoundDrawCount + ndx) : (ndx));

		gl.glGenBuffers(1, &m_indexBufferID);
		gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBufferID);
		gl.glBufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size() * sizeof(deUint16)), &indices[0], GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// data
	{
		const int dataSize = (m_op == INVALID_DATA_COUNT) ? (drawCount) : (overBoundDrawCount);

		// any data is ok
		gl.glGenBuffers(1, &m_dataBufferID);
		gl.glBindBuffer(GL_ARRAY_BUFFER, m_dataBufferID);
		gl.glBufferData(GL_ARRAY_BUFFER, dataSize * sizeof(float[4]), DE_NULL, GL_STATIC_DRAW);
		gl.glVertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.glEnableVertexAttribArray(posLocation);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// potentially instanced data
	{
		const int dataSize = drawInstances;

		gl.glGenBuffers(1, &m_colorBufferID);
		gl.glBindBuffer(GL_ARRAY_BUFFER, m_colorBufferID);
		gl.glBufferData(GL_ARRAY_BUFFER, dataSize * sizeof(float[4]), DE_NULL, GL_STATIC_DRAW);
		gl.glVertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.glEnableVertexAttribArray(colorLocation);
		gl.glVertexAttribDivisor(colorLocation, 1);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// command
	if (m_drawType == DRAW_ARRAYS)
	{
		DrawArraysCommand drawCommand;
		drawCommand.count				= overBoundDrawCount;
		drawCommand.primCount			= (m_op == INVALID_DATA_INSTANCED)	? (overBoundInstances)	: (drawInstances);
		drawCommand.first				= (m_op == INVALID_DATA_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.reservedMustBeZero	= (m_op == INVALID_RESERVED)		? (5)					: (0);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "drawCommand:"
			<< "\n\tcount:\t" << drawCommand.count
			<< "\n\tprimCount\t" << drawCommand.primCount
			<< "\n\tfirst\t" << drawCommand.first
			<< "\n\treservedMustBeZero\t" << drawCommand.reservedMustBeZero
			<< tcu::TestLog::EndMessage;

		gl.glGenBuffers(1, &m_cmdBufferID);
		gl.glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}
	else if (m_drawType == DRAW_ELEMENTS)
	{
		DrawElementsCommand drawCommand;
		drawCommand.count				= overBoundDrawCount;
		drawCommand.primCount			= (m_op == INVALID_DATA_INSTANCED)	? (overBoundInstances)	: (drawInstances);
		drawCommand.firstIndex			= (m_op == INVALID_INDEX_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.baseVertex			= (m_op == INVALID_DATA_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.reservedMustBeZero	= (m_op == INVALID_RESERVED)		? (5)					: (0);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "drawCommand:"
			<< "\n\tcount:\t" << drawCommand.count
			<< "\n\tprimCount\t" << drawCommand.primCount
			<< "\n\tfirstIndex\t" << drawCommand.firstIndex
			<< "\n\tbaseVertex\t" << drawCommand.baseVertex
			<< "\n\treservedMustBeZero\t" << drawCommand.reservedMustBeZero
			<< tcu::TestLog::EndMessage;

		gl.glGenBuffers(1, &m_cmdBufferID);
		gl.glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}
	else
		DE_ASSERT(DE_FALSE);

	gl.glViewport(0, 0, 1, 1);
	gl.glUseProgram(programID);

	if (m_drawType == DRAW_ELEMENTS)
		gl.glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_drawType == DRAW_ARRAYS)
		gl.glDrawArraysIndirect(GL_TRIANGLES, DE_NULL);
	else
		DE_ASSERT(DE_FALSE);

	gl.glUseProgram(0);
	gl.glFinish();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}